

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_rownumber_function.cpp
# Opt level: O3

void __thiscall
duckdb::WindowRowNumberLocalState::Finalize
          (WindowRowNumberLocalState *this,WindowExecutorGlobalState *gstate,
          CollectionPtr collection)

{
  WindowMergeSortTreeLocalState *this_00;
  
  WindowExecutorLocalState::Finalize((WindowExecutorLocalState *)this,gstate,collection);
  if ((this->local_tree).
      super_unique_ptr<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::WindowAggregatorState_*,_std::default_delete<duckdb::WindowAggregatorState>_>
      .super__Head_base<0UL,_duckdb::WindowAggregatorState_*,_false>._M_head_impl !=
      (WindowAggregatorState *)0x0) {
    this_00 = (WindowMergeSortTreeLocalState *)
              unique_ptr<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>,_true>
              ::operator->(&this->local_tree);
    WindowMergeSortTreeLocalState::Sort(this_00);
    WindowMergeSortTree::Build(this_00->window_tree);
    return;
  }
  return;
}

Assistant:

void WindowRowNumberLocalState::Finalize(WindowExecutorGlobalState &gstate, CollectionPtr collection) {
	WindowExecutorBoundsState::Finalize(gstate, collection);

	if (local_tree) {
		auto &local_tokens = local_tree->Cast<WindowMergeSortTreeLocalState>();
		local_tokens.Sort();
		local_tokens.window_tree.Build();
	}
}